

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-CTA-cs16btech11038.cpp
# Opt level: O2

int __thiscall FOCC_CTA::begin_trans(FOCC_CTA *this)

{
  int i;
  Transaction *this_00;
  mapped_type *ppTVar1;
  int id;
  int local_2c;
  
  std::__shared_mutex_pthread::lock(&(this->scheduler_lock)._M_impl);
  i = this->counter;
  local_2c = i;
  this_00 = (Transaction *)operator_new(0xc0);
  Transaction::Transaction(this_00,i,this->M);
  ppTVar1 = std::
            map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&local_2c);
  *ppTVar1 = this_00;
  this->counter = this->counter + 1;
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
  return local_2c;
}

Assistant:

int FOCC_CTA::begin_trans() {
    scheduler_lock.lock();

    //if(transactions.size()>FOCC_OTA_GARB_THRESH) garbageCollect();

    int id = counter;
    transactions[id] = new Transaction(id, M);
    counter++;
    scheduler_lock.unlock();

    return id;
}